

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O0

int __thiscall
cmCTestBuildAndTestHandler::RunCMake
          (cmCTestBuildAndTestHandler *this,string *outstring,ostringstream *out,
          string *cmakeOutString,cmake *cm)

{
  cmCTest *pcVar1;
  undefined8 uVar2;
  int iVar3;
  string *__x;
  ulong uVar4;
  size_type sVar5;
  reference __x_00;
  ostream *poVar6;
  char *pcVar7;
  string local_4e8 [32];
  string local_4c8 [32];
  undefined1 local_4a8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_330 [36];
  undefined4 local_30c;
  string local_308 [32];
  string local_2e8 [32];
  undefined1 local_2c8 [8];
  ostringstream cmCTestLog_msg;
  string local_150 [39];
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string btype;
  char *config;
  undefined1 local_d8 [8];
  string toolset;
  undefined1 local_b0 [8];
  string platform;
  undefined1 local_88 [8];
  string generator;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  uint k;
  cmake *cm_local;
  string *cmakeOutString_local;
  ostringstream *out_local;
  string *outstring_local;
  cmCTestBuildAndTestHandler *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
  __x = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58,&this->SourceDir);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_88,"-G",(allocator *)(platform.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(platform.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_88,(string *)&this->BuildGenerator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,(value_type *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_b0,"-A",(allocator *)(toolset.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(toolset.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&this->BuildGeneratorPlatform);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,(value_type *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d8,"-T",(allocator *)((long)&config + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
    std::__cxx11::string::operator+=((string *)local_d8,(string *)&this->BuildGeneratorToolset);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,(value_type *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
  }
  btype.field_2._8_8_ = 0;
  cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    btype.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  uVar2 = btype.field_2._8_8_;
  if (btype.field_2._8_8_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,(char *)uVar2,&local_129);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "-DCMAKE_BUILD_TYPE:STRING=",&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,(value_type *)local_108);
    std::__cxx11::string::~string((string *)local_108);
  }
  for (args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar4 = (ulong)args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->BuildOptions), uVar4 < sVar5;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    __x_00 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->BuildOptions,
                          (ulong)args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,__x_00);
  }
  iVar3 = cmake::Run(cm,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_58);
  if (iVar3 == 0) {
    if (((this->BuildTwoConfig & 1U) == 0) ||
       (iVar3 = cmake::Run(cm,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_58), iVar3 == 0)) {
      std::operator<<((ostream *)out,"======== CMake output     ======\n");
      std::operator<<((ostream *)out,(string *)cmakeOutString);
      std::operator<<((ostream *)out,"======== End CMake output ======\n");
      this_local._4_4_ = 0;
    }
    else {
      std::operator<<((ostream *)out,"Error: cmake execution failed\n");
      poVar6 = std::operator<<((ostream *)out,(string *)cmakeOutString);
      std::operator<<(poVar6,"\n");
      if (outstring == (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
        std::__cxx11::ostringstream::str();
        poVar6 = std::operator<<((ostream *)local_4a8,local_4c8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_4c8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,0x68,pcVar7,false);
        std::__cxx11::string::~string(local_4e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)outstring,local_330);
        std::__cxx11::string::~string(local_330);
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    std::operator<<((ostream *)out,"Error: cmake execution failed\n");
    poVar6 = std::operator<<((ostream *)out,(string *)cmakeOutString);
    std::operator<<(poVar6,"\n");
    if (outstring == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::__cxx11::ostringstream::str();
      poVar6 = std::operator<<((ostream *)local_2c8,local_2e8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2e8);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,0x5c,pcVar7,false);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    }
    else {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)outstring,local_150);
      std::__cxx11::string::~string(local_150);
    }
    this_local._4_4_ = 1;
  }
  local_30c = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMake(std::string* outstring,
                                         std::ostringstream& out,
                                         std::string& cmakeOutString,
                                         cmake* cm)
{
  unsigned int k;
  std::vector<std::string> args;
  args.push_back(cmSystemTools::GetCMakeCommand());
  args.push_back(this->SourceDir);
  if (!this->BuildGenerator.empty()) {
    std::string generator = "-G";
    generator += this->BuildGenerator;
    args.push_back(generator);
  }
  if (!this->BuildGeneratorPlatform.empty()) {
    std::string platform = "-A";
    platform += this->BuildGeneratorPlatform;
    args.push_back(platform);
  }
  if (!this->BuildGeneratorToolset.empty()) {
    std::string toolset = "-T";
    toolset += this->BuildGeneratorToolset;
    args.push_back(toolset);
  }

  const char* config = CM_NULLPTR;
  if (!this->CTest->GetConfigType().empty()) {
    config = this->CTest->GetConfigType().c_str();
  }
#ifdef CMAKE_INTDIR
  if (!config) {
    config = CMAKE_INTDIR;
  }
#endif

  if (config) {
    std::string btype = "-DCMAKE_BUILD_TYPE:STRING=" + std::string(config);
    args.push_back(btype);
  }

  for (k = 0; k < this->BuildOptions.size(); ++k) {
    args.push_back(this->BuildOptions[k]);
  }
  if (cm->Run(args) != 0) {
    out << "Error: cmake execution failed\n";
    out << cmakeOutString << "\n";
    if (outstring) {
      *outstring = out.str();
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
    }
    return 1;
  }
  // do another config?
  if (this->BuildTwoConfig) {
    if (cm->Run(args) != 0) {
      out << "Error: cmake execution failed\n";
      out << cmakeOutString << "\n";
      if (outstring) {
        *outstring = out.str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
      }
      return 1;
    }
  }
  out << "======== CMake output     ======\n";
  out << cmakeOutString;
  out << "======== End CMake output ======\n";
  return 0;
}